

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O2

void __thiscall cmCTestHandlerCommand::BindArguments(cmCTestHandlerCommand *this)

{
  cmArgumentParser<void> *this_00;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  
  this_00 = &this->super_cmArgumentParser<void>;
  cmArgumentParser<void>::BindParsedKeywords(this_00,&this->ParsedKeywords);
  name.super_string_view._M_str = "APPEND";
  name.super_string_view._M_len = 6;
  cmArgumentParser<void>::Bind<bool>(this_00,name,&this->Append);
  name_00.super_string_view._M_str = "QUIET";
  name_00.super_string_view._M_len = 5;
  cmArgumentParser<void>::Bind<bool>(this_00,name_00,&this->Quiet);
  name_01.super_string_view._M_str = "RETURN_VALUE";
  name_01.super_string_view._M_len = 0xc;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_01,&this->ReturnValue);
  name_02.super_string_view._M_str = "CAPTURE_CMAKE_ERROR";
  name_02.super_string_view._M_len = 0x13;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_02,&this->CaptureCMakeError);
  name_03.super_string_view._M_str = "SOURCE";
  name_03.super_string_view._M_len = 6;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_03,&this->Source);
  name_04.super_string_view._M_str = "BUILD";
  name_04.super_string_view._M_len = 5;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_04,&this->Build);
  name_05.super_string_view._M_str = "SUBMIT_INDEX";
  name_05.super_string_view._M_len = 0xc;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_05,&this->SubmitIndex);
  return;
}

Assistant:

void cmCTestHandlerCommand::BindArguments()
{
  this->BindParsedKeywords(this->ParsedKeywords);
  this->Bind("APPEND"_s, this->Append);
  this->Bind("QUIET"_s, this->Quiet);
  this->Bind("RETURN_VALUE"_s, this->ReturnValue);
  this->Bind("CAPTURE_CMAKE_ERROR"_s, this->CaptureCMakeError);
  this->Bind("SOURCE"_s, this->Source);
  this->Bind("BUILD"_s, this->Build);
  this->Bind("SUBMIT_INDEX"_s, this->SubmitIndex);
}